

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O0

void __thiscall Tiles::Tiles(Tiles *this)

{
  int iVar1;
  int switchCase;
  Tiles *this_local;
  
  iVar1 = rand();
  switch(iVar1 % 5) {
  case 0:
    this->data = WATER;
    break;
  case 1:
    this->data = GRASS;
    break;
  case 2:
    this->data = PATH;
    break;
  case 3:
    this->data = MOUNTAIN;
    break;
  case 4:
    this->data = FOREST;
    break;
  default:
    this->data = EMPTY;
  }
  return;
}

Assistant:

Tiles::Tiles()
{
	//Quick Test
	int switchCase = rand() % 5;

	switch(switchCase)
	{
		case 0:
			data = WATER;
			break;
		case 1:
			data = GRASS;
			break;
		case 2:
			data = PATH;
			break;
		case 3:
			data = MOUNTAIN;
			break;
		case 4:
			data = FOREST;
			break;
		default: data = EMPTY;
	}
	//data = WATER;
}